

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

bool __thiscall
matchit::impl::Id<mathiu::impl::List>::matchValue<mathiu::impl::List_const&>
          (Id<mathiu::impl::List> *this,List *v)

{
  ExprPtr *pEVar1;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>,_const_std::variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>_&>
  _Var2;
  bool bVar3;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::List>,_matchit::impl::IdBlock<mathiu::impl::List>_*>_&>
  pIVar4;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::List,_mathiu::impl::List_*,_const_mathiu::impl::List_*>_&>
  pLVar5;
  ExprPtr *lhs;
  ExprPtr *rhs;
  bool bVar6;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_2d;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1173:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1175:45),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1179:45)>
  local_2c;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_2b;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
  local_2a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
  local_29;
  
  pIVar4 = std::
           visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>&)_1_,matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::List>,matchit::impl::IdBlock<mathiu::impl::List>*>&>
                     (&local_2d,&this->mBlock);
  _Var2 = std::
          visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::List>::hasValue()const::_lambda(mathiu::impl::List_const&)_1_,matchit::impl::IdBlock<mathiu::impl::List>::hasValue()const::_lambda(mathiu::impl::List_const*)_1_,matchit::impl::IdBlock<mathiu::impl::List>::hasValue()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::List,mathiu::impl::List*,mathiu::impl::List_const*>const&>
                    (&local_2c,&(pIVar4->super_IdBlockBase<mathiu::impl::List>).mVariant);
  if (_Var2) {
    pIVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>&)_1_,matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::List>,matchit::impl::IdBlock<mathiu::impl::List>*>&>
                       (&local_2b,&this->mBlock);
    pLVar5 = std::
             visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::List>::get()const::_lambda(mathiu::impl::List_const&)_1_,matchit::impl::IdBlock<mathiu::impl::List>::get()const::_lambda(mathiu::impl::List_const*)_1_,matchit::impl::IdBlock<mathiu::impl::List>::get()const::_lambda(mathiu::impl::List*)_1_,matchit::impl::IdBlock<mathiu::impl::List>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::List,mathiu::impl::List*,mathiu::impl::List_const*>const&>
                       (&local_2a,&(pIVar4->super_IdBlockBase<mathiu::impl::List>).mVariant);
    lhs = (pLVar5->super_ExprPtrList).
          super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (pLVar5->super_ExprPtrList).
             super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    rhs = (v->super_ExprPtrList).
          super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pEVar1 - (long)lhs ==
        (long)(v->super_ExprPtrList).
              super__Vector_base<std::shared_ptr<const_mathiu::impl::Expr>,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)rhs) {
      bVar6 = lhs == pEVar1;
      if ((!bVar6) && (bVar3 = mathiu::impl::equal(lhs,rhs), bVar3)) {
        do {
          rhs = rhs + 1;
          lhs = lhs + 1;
          bVar6 = lhs == pEVar1;
          if (bVar6) {
            return bVar6;
          }
          bVar3 = mathiu::impl::equal(lhs,rhs);
        } while (bVar3);
      }
    }
    else {
      bVar6 = false;
    }
  }
  else {
    pIVar4 = std::
             visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>&)_1_,matchit::impl::Id<mathiu::impl::List>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::List>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::List>,matchit::impl::IdBlock<mathiu::impl::List>*>&>
                       (&local_29,&this->mBlock);
    IdUtil<mathiu::impl::List>::bindValue<mathiu::impl::List_const&>
              (&(pIVar4->super_IdBlockBase<mathiu::impl::List>).mVariant,v);
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }